

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManCnfAddStatic(sat_solver2 *pSat,Vec_Int_t *vCnf0,Vec_Int_t *vCnf1,int *Lits,int iLitOut,
                        int ProofId)

{
  int iVar1;
  lit lVar2;
  long lVar3;
  lit local_7c;
  Vec_Int_t *local_70;
  lit local_68 [2];
  int ClaLits [6];
  int nClaLits;
  int Literal;
  int Cube;
  int b;
  int k;
  int i;
  Vec_Int_t *vCnf;
  int ProofId_local;
  int iLitOut_local;
  int *Lits_local;
  Vec_Int_t *vCnf1_local;
  Vec_Int_t *vCnf0_local;
  sat_solver2 *pSat_local;
  
  b = 0;
  do {
    if (1 < b) {
      return;
    }
    local_70 = vCnf0;
    if (b != 0) {
      local_70 = vCnf1;
    }
    for (Cube = 0; iVar1 = Vec_IntSize(local_70), Cube < iVar1; Cube = Cube + 1) {
      iVar1 = Vec_IntEntry(local_70,Cube);
      ClaLits[4] = 0;
      local_7c = iLitOut;
      if (b != 0) {
        local_7c = lit_neg(iLitOut);
      }
      lVar3 = (long)ClaLits[4];
      ClaLits[4] = ClaLits[4] + 1;
      ClaLits[lVar3 + -2] = local_7c;
      for (Literal = 0; Literal < 5; Literal = Literal + 1) {
        ClaLits[5] = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
        if (ClaLits[5] == 1) {
          lVar3 = (long)ClaLits[4];
          ClaLits[4] = ClaLits[4] + 1;
          ClaLits[lVar3 + -2] = Lits[Literal];
        }
        else if (ClaLits[5] == 2) {
          lVar2 = lit_neg(Lits[Literal]);
          lVar3 = (long)ClaLits[4];
          ClaLits[4] = ClaLits[4] + 1;
          ClaLits[lVar3 + -2] = lVar2;
        }
        else if (ClaLits[5] != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0x2c5,
                        "void Ga2_ManCnfAddStatic(sat_solver2 *, Vec_Int_t *, Vec_Int_t *, int *, int, int)"
                       );
        }
      }
      sat_solver2_addclause(pSat,local_68,ClaLits + (long)ClaLits[4] + -2,ProofId);
    }
    b = b + 1;
  } while( true );
}

Assistant:

void Ga2_ManCnfAddStatic( sat_solver2 * pSat, Vec_Int_t * vCnf0, Vec_Int_t * vCnf1, int Lits[], int iLitOut, int ProofId )
{
    Vec_Int_t * vCnf;
    int i, k, b, Cube, Literal, nClaLits, ClaLits[6];
    for ( i = 0; i < 2; i++ )
    {
        vCnf = i ? vCnf1 : vCnf0;
        Vec_IntForEachEntry( vCnf, Cube, k )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            for ( b = 0; b < 5; b++ )
            {
                Literal = 3 & (Cube >> (b << 1));
                if ( Literal == 1 ) // value 0 --> add positive literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Literal == 2 ) // value 1 --> add negative literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                else if ( Literal != 0 )
                    assert( 0 );
            }
            sat_solver2_addclause( pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}